

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O2

RK_U32 vp8hwdDecodeBool(vpBoolCoder_t *bit_ctx,RK_S32 probability)

{
  uint uVar1;
  int iVar2;
  RK_U32 RVar3;
  uint uVar4;
  RK_S32 RVar5;
  RK_U32 RVar6;
  bool bVar7;
  bool bVar8;
  
  RVar5 = bit_ctx->count;
  RVar6 = bit_ctx->range;
  uVar4 = bit_ctx->value;
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x43,"vp8hwdDecodeBool"
              );
  }
  RVar6 = ((RVar6 - 1) * probability >> 8) + 1;
  bVar7 = RVar6 * 0x1000000 <= uVar4;
  iVar2 = RVar6 * -0x1000000;
  if (bVar7) {
    RVar6 = bit_ctx->range - RVar6;
    uVar4 = uVar4 + iVar2;
  }
  if (RVar6 < 0x80) {
    do {
      RVar3 = RVar6 * 2;
      uVar4 = uVar4 * 2;
      RVar5 = RVar5 + -1;
      if (RVar5 == 0) {
        uVar1 = bit_ctx->pos;
        if (bit_ctx->streamEndPos <= uVar1) {
          bit_ctx->strmError = 1;
          RVar5 = 0;
          _mpp_log_l(4,"vp8d_parser","vp8hwdDecodeBool read end",(char *)0x0);
          break;
        }
        uVar4 = uVar4 | bit_ctx->buffer[uVar1];
        bit_ctx->pos = uVar1 + 1;
        RVar5 = 8;
      }
      bVar8 = RVar6 < 0x40;
      RVar6 = RVar3;
    } while (bVar8);
    bit_ctx->count = RVar5;
    bit_ctx->value = uVar4;
    bit_ctx->range = RVar3;
    if (((byte)vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x6a,
                 "vp8hwdDecodeBool");
    }
  }
  else {
    bit_ctx->value = uVar4;
    bit_ctx->range = RVar6;
  }
  return (uint)bVar7;
}

Assistant:

static RK_U32 vp8hwdDecodeBool(vpBoolCoder_t *bit_ctx, RK_S32 probability)
{
    RK_U32  bit = 0;
    RK_U32  split;
    RK_U32  bigsplit;
    RK_U32  count = bit_ctx->count;
    RK_U32  range = bit_ctx->range;
    RK_U32  value = bit_ctx->value;

    FUN_T("FUN_IN");
    split = 1 + (((range - 1) * probability) >> 8);
    bigsplit = (split << 24);
    range = split;

    if (value >= bigsplit) {
        range = bit_ctx->range - split;
        value = value - bigsplit;
        bit = 1;
    }

    if (range >= 0x80) {
        bit_ctx->value = value;
        bit_ctx->range = range;
        return bit;
    } else {
        do {
            range += range;
            value += value;

            if (!--count) {
                /* no more stream to read? */
                if (bit_ctx->pos >= bit_ctx->streamEndPos) {
                    bit_ctx->strmError = 1;
                    mpp_log("vp8hwdDecodeBool read end");
                    break;
                }
                count = 8;
                value |=  bit_ctx->buffer[bit_ctx->pos];
                bit_ctx->pos++;
            }
        } while (range < 0x80);
    }


    bit_ctx->count = count;
    bit_ctx->value = value;
    bit_ctx->range = range;

    FUN_T("FUN_OUT");
    return bit;
}